

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

int32_t __thiscall
helics::CommonCore::getHandleOption(CommonCore *this,InterfaceHandle handle,int32_t option)

{
  int32_t iVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar2;
  FederateState *this_00;
  shared_mutex *__rwlock;
  
  ppVar2 = getHandleInfo(this,handle);
  iVar1 = 0;
  if (ppVar2 != (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
    if ((option == 0x192) || (option == 0x18d)) {
      __rwlock = &(this->handles).m_mutex;
      std::__shared_mutex_pthread::lock_shared(&__rwlock->_M_impl);
      iVar1 = HandleManager::getHandleOption(&(this->handles).m_obj,handle,option);
      pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
    }
    else {
      iVar1 = 0;
      if (*(char *)((long)&(ppVar2->first)._M_string_length + 4) != 'f') {
        this_00 = getFederateAt(this,(LocalFederateId)(BaseType)(ppVar2->first)._M_string_length);
        if (this_00 != (FederateState *)0x0) {
          iVar1 = FederateState::getHandleOption
                            (this_00,handle,*(char *)((long)&(ppVar2->first)._M_string_length + 4),
                             option);
          return iVar1;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int32_t CommonCore::getHandleOption(InterfaceHandle handle, int32_t option) const
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo == nullptr) {
        return 0;
    }
    switch (option) {
        case defs::Options::CONNECTION_REQUIRED:
        case defs::Options::CONNECTION_OPTIONAL:
            return handles.read(
                [handle, option](auto& hand) { return hand.getHandleOption(handle, option); });
        default:
            break;
    }
    if (handleInfo->handleType != InterfaceType::FILTER) {
        auto* fed = getFederateAt(handleInfo->local_fed_id);
        if (fed != nullptr) {
            return fed->getHandleOption(handle, static_cast<char>(handleInfo->handleType), option);
        }
    } else {
        // must be for filter
    }
    return 0;
}